

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

DynamicObject *
TTD::NSSnapObjects::ObjectPropertyReset_WellKnown
          (SnapObject *snpObject,DynamicObject *dynObj,InflateMap *inflator)

{
  SnapHandler *pSVar1;
  SnapHandlerPropertyEntry *pSVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this;
  ArrayObject *pAVar6;
  JavascriptArray *objArray;
  EntryType *pEVar7;
  int32 i;
  uint uVar8;
  ulong uVar9;
  uint local_58;
  PropertyId pid;
  RecyclableObject *local_38;
  
  if (snpObject->OptWellKnownToken == (TTD_WELLKNOWN_TOKEN)0x0) {
    TTDAbort_unrecoverable_error("Should only call this on well known objects.");
  }
  this = &InflateMap::GetPropertyResetSet(inflator)->
          super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ;
  JsUtil::
  BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Clear(this);
  uVar8 = 0;
  while( true ) {
    iVar5 = (*(dynObj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[10])(dynObj);
    if (iVar5 <= (int)uVar8) break;
    local_58 = (*(dynObj->super_RecyclableObject).super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                         (dynObj,(ulong)(uVar8 & 0xffff));
    if (local_58 != 0xffffffff) {
      JsUtil::
      BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::AddNew((BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)this,(int *)&stack0xffffffffffffffa8);
    }
    uVar8 = uVar8 + 1;
  }
  pSVar1 = snpObject->SnapType->TypeHandlerInfo;
  for (uVar9 = 0; uVar9 < pSVar1->MaxPropertyIndex; uVar9 = uVar9 + 1) {
    pSVar2 = pSVar1->PropertyInfoArray;
    uVar8 = pSVar2[uVar9].PropertyRecordId;
    if ((pSVar2[uVar9].DataKind != Clear) || (uVar8 < 0x10)) {
      local_58 = uVar8;
      JsUtil::
      BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Remove((BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)this,(int *)&stack0xffffffffffffffa8);
    }
  }
  if (this->count != this->freeCount) {
    local_38 = (((((((((dynObj->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                   super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
    JsUtil::
    BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
    ::EntryIterator((EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)&stack0xffffffffffffffa8,
                    (BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)this);
    while( true ) {
      bVar4 = JsUtil::
              BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                         *)&stack0xffffffffffffffa8);
      if (!bVar4) break;
      pEVar7 = JsUtil::
               BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ::
               IteratorBase<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
               ::Current((IteratorBase<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                          *)&stack0xffffffffffffffa8);
      uVar8 = (pEVar7->
              super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              ).super_ImplicitKeyValueEntry<int,_int>.
              super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
              super_ValueEntryData<int>.value;
      if (0xffffffee < uVar8 - 0x10) {
        TTDAbort_unrecoverable_error("This shouldn\'t happen!!!");
      }
      iVar5 = (*(dynObj->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x31])
                        (dynObj,(ulong)uVar8);
      pp_Var3 = (dynObj->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
      if (iVar5 == 0) {
        iVar5 = (*pp_Var3[0x17])(dynObj,(ulong)uVar8,local_38,8,0);
      }
      else {
        iVar5 = (*pp_Var3[0x21])(dynObj,(ulong)uVar8,8);
      }
      if (iVar5 == 0) {
        TTDAbort_unrecoverable_error("This property is stuck!!!");
      }
      JsUtil::
      BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  *)&stack0xffffffffffffffa8);
    }
  }
  JsUtil::
  BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Clear(this);
  pAVar6 = Js::DynamicObject::GetObjectArray(dynObj);
  if (pAVar6 != (ArrayObject *)0x0) {
    objArray = Js::JavascriptLibrary::CreateArray
                         ((((dynObj->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr);
    Js::DynamicObject::SetObjectArray(dynObj,&objArray->super_ArrayObject);
  }
  return dynObj;
}

Assistant:

Js::DynamicObject* ObjectPropertyReset_WellKnown(const SnapObject* snpObject, Js::DynamicObject* dynObj, InflateMap* inflator)
        {
            TTDAssert(snpObject->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN, "Should only call this on well known objects.");

            JsUtil::BaseHashSet<Js::PropertyId, HeapAllocator>& propertyReset = inflator->GetPropertyResetSet();
            propertyReset.Clear();

            ////
            for(int32 i = 0; i < dynObj->GetPropertyCount(); i++)
            {
                Js::PropertyId pid = dynObj->GetPropertyId((Js::PropertyIndex)i);
                if(pid != Js::Constants::NoProperty)
                {
                    propertyReset.AddNew(pid);
                }
            }

            const NSSnapType::SnapHandler* handler = snpObject->SnapType->TypeHandlerInfo;
            for(uint32 i = 0; i < handler->MaxPropertyIndex; ++i)
            {
                BOOL willOverwriteLater = (handler->PropertyInfoArray[i].DataKind != NSSnapType::SnapEntryDataKindTag::Clear);
                BOOL isInternal = Js::IsInternalPropertyId(handler->PropertyInfoArray[i].PropertyRecordId);

                if(willOverwriteLater | isInternal)
                {
                    Js::PropertyId pid = handler->PropertyInfoArray[i].PropertyRecordId;
                    propertyReset.Remove(pid);
                }
            }

            Js::Var undefined = dynObj->GetScriptContext()->GetLibrary()->GetUndefined();
            if(propertyReset.Count() != 0)
            {
                for(auto iter = propertyReset.GetIterator(); iter.IsValid(); iter.MoveNext())
                {
                    BOOL ok = FALSE;
                    Js::PropertyId pid = iter.CurrentValue();
                    TTDAssert(pid != Js::Constants::NoProperty && !Js::IsInternalPropertyId(pid), "This shouldn't happen!!!");

                    if(!dynObj->IsConfigurable(pid))
                    {
                        ok = dynObj->SetProperty(pid, undefined, Js::PropertyOperationFlags::PropertyOperation_Force, nullptr);
                    }
                    else
                    {
                        ok = dynObj->DeleteProperty(pid, Js::PropertyOperationFlags::PropertyOperation_Force);
                    }

                    TTDAssert(ok, "This property is stuck!!!");
                }
            }

            propertyReset.Clear();
            ////

            //always reset the index array as this is unusual and annoying to iterate over a bunch
            Js::ArrayObject* parray = dynObj->GetObjectArray();
            if(parray != nullptr)
            {
                Js::JavascriptArray* newArray = dynObj->GetLibrary()->CreateArray();
                dynObj->SetObjectArray(newArray);
            }

            return dynObj;
        }